

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode connect_SOCKS(Curl_easy *data,int sockindex,_Bool *done)

{
  connectdata *pcVar1;
  char *hostname;
  CURLproxycode CVar2;
  CURLcode CVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  
  pcVar1 = data->conn;
  uVar4 = *(uint *)&(pcVar1->bits).field_0x4;
  if ((uVar4 & 2) == 0) {
    *done = true;
    CVar3 = CURLE_OK;
  }
  else {
    lVar5 = 0x128;
    if ((((uVar4 & 1) == 0) && (lVar5 = 200, (uVar4 >> 9 & 1) == 0)) &&
       (lVar5 = 0x98, sockindex == 1)) {
      lVar5 = 0xb0;
    }
    if ((uVar4 & 1) == 0) {
      if (sockindex == 1) {
        uVar4 = (uint)pcVar1->secondary_port;
      }
      else if ((uVar4 >> 10 & 1) == 0) {
        uVar4 = pcVar1->remote_port;
      }
      else {
        uVar4 = pcVar1->conn_to_port;
      }
    }
    else {
      uVar4 = (uint)(pcVar1->http_proxy).port;
    }
    uVar6 = (uint)(pcVar1->socks_proxy).proxytype;
    if (uVar6 - 4 < 4) {
      hostname = *(char **)((pcVar1->chunk).hexbuffer + lVar5 + -0x3d);
      switch(uVar6) {
      default:
        CVar2 = Curl_SOCKS4((pcVar1->socks_proxy).user,hostname,uVar4,sockindex,data,done);
        break;
      case 5:
      case 7:
        CVar2 = Curl_SOCKS5((pcVar1->socks_proxy).user,(pcVar1->socks_proxy).passwd,hostname,uVar4,
                            sockindex,data,done);
      }
      CVar3 = CURLE_OK;
    }
    else {
      CVar2 = CURLPX_OK;
      Curl_failf(data,"unknown proxytype option given");
      CVar3 = CURLE_COULDNT_CONNECT;
    }
    if (CVar2 != CURLPX_OK) {
      (data->info).pxcode = CVar2;
      CVar3 = CURLE_PROXY;
    }
  }
  return CVar3;
}

Assistant:

static CURLcode connect_SOCKS(struct Curl_easy *data, int sockindex,
                              bool *done)
{
  CURLcode result = CURLE_OK;
#ifndef CURL_DISABLE_PROXY
  CURLproxycode pxresult = CURLPX_OK;
  struct connectdata *conn = data->conn;
  if(conn->bits.socksproxy) {
    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */
    const char * const host =
      conn->bits.httpproxy ?
      conn->http_proxy.host.name :
      conn->bits.conn_to_host ?
      conn->conn_to_host.name :
      sockindex == SECONDARYSOCKET ?
      conn->secondaryhostname : conn->host.name;
    const int port =
      conn->bits.httpproxy ? (int)conn->http_proxy.port :
      sockindex == SECONDARYSOCKET ? conn->secondary_port :
      conn->bits.conn_to_port ? conn->conn_to_port :
      conn->remote_port;
    switch(conn->socks_proxy.proxytype) {
    case CURLPROXY_SOCKS5:
    case CURLPROXY_SOCKS5_HOSTNAME:
      pxresult = Curl_SOCKS5(conn->socks_proxy.user, conn->socks_proxy.passwd,
                             host, port, sockindex, data, done);
      break;

    case CURLPROXY_SOCKS4:
    case CURLPROXY_SOCKS4A:
      pxresult = Curl_SOCKS4(conn->socks_proxy.user, host, port, sockindex,
                             data, done);
      break;

    default:
      failf(data, "unknown proxytype option given");
      result = CURLE_COULDNT_CONNECT;
    } /* switch proxytype */
    if(pxresult) {
      result = CURLE_PROXY;
      data->info.pxcode = pxresult;
    }
  }
  else
#else
    (void)data;
    (void)sockindex;
#endif /* CURL_DISABLE_PROXY */
    *done = TRUE; /* no SOCKS proxy, so consider us connected */

  return result;
}